

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalNinjaGenerator::OpenBuildFileStreams(cmGlobalNinjaGenerator *this)

{
  char *__s;
  bool bVar1;
  type pcVar2;
  ostream *poVar3;
  allocator<char> local_39;
  string local_38;
  cmGlobalNinjaGenerator *local_18;
  cmGlobalNinjaGenerator *this_local;
  
  __s = NINJA_BUILD_FILE;
  local_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  bVar1 = OpenFileStream(this,&this->BuildFileStream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
             operator*(&this->BuildFileStream);
    poVar3 = std::operator<<((ostream *)pcVar2,
                             "# This file contains all the build statements describing the\n");
    std::operator<<(poVar3,"# compilation DAG.\n\n");
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}